

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O0

void __thiscall
basisu::basisu_frontend::create_optimized_selector_codebook(basisu_frontend *this,uint32_t iter)

{
  uint a;
  uint32_t uVar1;
  vector<unsigned_int> *pvVar2;
  uint in_ESI;
  long in_RDI;
  char buf [256];
  uint32_t x_1;
  uint32_t y_1;
  etc_block *blk;
  uint32_t block_index;
  uint32_t i_1;
  uint32_t x;
  uint32_t y;
  vector<unsigned_int> *cluster_block_indices;
  uint32_t selector_cluster_index;
  image selector_cluster_vis;
  uint32_t x_spacer_len;
  uint32_t i;
  uint32_t max_selector_cluster_size;
  uint32_t last_index;
  uint32_t first_index;
  uint32_t cluster_index_iter;
  uint32_t N;
  uint32_t total_selector_clusters;
  interval_timer tm;
  size_t in_stack_fffffffffffffd98;
  char *__s;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffda8;
  uint32_t in_stack_fffffffffffffdac;
  image *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  uint uVar3;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  job_pool *in_stack_fffffffffffffde0;
  char local_1e8 [72];
  uint local_e0;
  uint local_dc;
  uint local_c8;
  uint local_c0;
  uint local_bc;
  uint local_ac;
  image local_a8;
  undefined4 local_88;
  uint local_84;
  uint local_80;
  uint local_68;
  uint local_64;
  uint local_3c;
  uint local_38;
  uint local_34;
  undefined4 local_30;
  uint32_t local_2c;
  uint local_c;
  
  local_c = in_ESI;
  debug_printf("create_optimized_selector_codebook\n");
  interval_timer::interval_timer((interval_timer *)0x4e65ae);
  interval_timer::start
            ((interval_timer *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  local_2c = vector<basisu::vector<unsigned_int>_>::size
                       ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x120));
  uVar1 = vector<basisu::vector<unsigned_int>_>::size
                    ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x120));
  debug_printf("Total selector clusters (from m_selector_cluster_block_indices.size()): %u\n",
               (ulong)uVar1);
  vector<basisu::etc_block>::resize
            ((vector<basisu::etc_block> *)in_stack_fffffffffffffdb0,
             CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             SUB41((uint)in_stack_fffffffffffffda4 >> 0x18,0));
  local_30 = 0x100;
  for (local_34 = 0; local_34 < local_2c; local_34 = local_34 + 0x100) {
    local_38 = local_34;
    local_64 = minimum<unsigned_int>(local_2c,local_34 + 0x100);
    local_68 = local_38;
    local_3c = local_64;
    std::function<void()>::
    function<basisu::basisu_frontend::create_optimized_selector_codebook(unsigned_int)::__0,void>
              ((function<void_()> *)in_stack_fffffffffffffdb0,
               (anon_class_16_3_3cbd76c5 *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    job_pool::add_job((job_pool *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                      (function<void_()> *)
                      CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    std::function<void_()>::~function((function<void_()> *)0x4e66d4);
  }
  job_pool::wait_for_all(in_stack_fffffffffffffde0);
  interval_timer::get_elapsed_secs
            ((interval_timer *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  debug_printf("Elapsed time: %3.3f secs\n");
  if ((*(byte *)(in_RDI + 0x1e) & 1) != 0) {
    local_80 = 0;
    for (local_84 = 0; uVar3 = local_84,
        uVar1 = vector<basisu::vector<unsigned_int>_>::size
                          ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x120)), a = local_80,
        uVar3 < uVar1; local_84 = local_84 + 1) {
      pvVar2 = vector<basisu::vector<unsigned_int>_>::operator[]
                         ((vector<basisu::vector<unsigned_int>_> *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                          in_stack_fffffffffffffd98);
      uVar1 = vector<unsigned_int>::size(pvVar2);
      local_80 = maximum<unsigned_int>(a,uVar1);
    }
    if (local_80 * 5 < 0x8000) {
      local_88 = 0x10;
      vector<basisu::vector<unsigned_int>_>::size
                ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x120));
      image::image((image *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   (uint32_t)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                   (uint32_t)in_stack_fffffffffffffdb8,
                   (uint32_t)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      for (local_ac = 0;
          uVar1 = vector<basisu::vector<unsigned_int>_>::size
                            ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x120)),
          local_ac < uVar1; local_ac = local_ac + 1) {
        pvVar2 = vector<basisu::vector<unsigned_int>_>::operator[]
                           ((vector<basisu::vector<unsigned_int>_> *)
                            CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                            in_stack_fffffffffffffd98);
        for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
          for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
            vector<basisu::etc_block>::operator[]
                      ((vector<basisu::etc_block> *)
                       CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       in_stack_fffffffffffffd98);
            etc_block::get_selector
                      ((etc_block *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       (uint32_t)(in_stack_fffffffffffffd98 >> 0x20),
                       (uint32_t)in_stack_fffffffffffffd98);
            color_rgba::color_rgba
                      ((color_rgba *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       (int)(in_stack_fffffffffffffd98 >> 0x20));
            image::set_clipped(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                               in_stack_fffffffffffffda8,
                               (color_rgba *)
                               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
          }
        }
        local_c8 = 0;
        while (uVar3 = local_c8, uVar1 = vector<unsigned_int>::size(pvVar2), uVar3 < uVar1) {
          vector<unsigned_int>::operator[]
                    ((vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd98);
          in_stack_fffffffffffffdb0 =
               (image *)vector<basisu::etc_block>::operator[]
                                  ((vector<basisu::etc_block> *)
                                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                                   in_stack_fffffffffffffd98);
          for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
            for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
              in_stack_fffffffffffffda4 = local_e0 + 0x10 + local_c8 * 5;
              in_stack_fffffffffffffda8 = local_ac * 5 + local_dc;
              in_stack_fffffffffffffdac =
                   etc_block::get_selector
                             ((etc_block *)
                              CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                              (uint32_t)(in_stack_fffffffffffffd98 >> 0x20),
                              (uint32_t)in_stack_fffffffffffffd98);
              color_rgba::color_rgba
                        ((color_rgba *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)
                         ,(int)(in_stack_fffffffffffffd98 >> 0x20));
              image::set_clipped(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                                 in_stack_fffffffffffffda8,
                                 (color_rgba *)
                                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
            }
          }
          local_c8 = local_c8 + 1;
        }
      }
      uVar1 = 0;
      __s = local_1e8;
      snprintf(__s,0x100,"selector_cluster_vis_%u.png",(ulong)local_c);
      save_png(__s,&local_a8,uVar1,uVar1);
      image::~image((image *)0x4e6bcf);
    }
  }
  return;
}

Assistant:

void basisu_frontend::create_optimized_selector_codebook(uint32_t iter)
	{
		debug_printf("create_optimized_selector_codebook\n");

		interval_timer tm;
		tm.start();

		const uint32_t total_selector_clusters = (uint32_t)m_selector_cluster_block_indices.size();

		debug_printf("Total selector clusters (from m_selector_cluster_block_indices.size()): %u\n", (uint32_t)m_selector_cluster_block_indices.size());

		m_optimized_cluster_selectors.resize(total_selector_clusters);
		
		// For each selector codebook entry, and for each of the 4x4 selectors, determine which selector minimizes the error across all the blocks that use that quantized selector.
		const uint32_t N = 256;
		for (uint32_t cluster_index_iter = 0; cluster_index_iter < total_selector_clusters; cluster_index_iter += N)
		{
			const uint32_t first_index = cluster_index_iter;
			const uint32_t last_index = minimum<uint32_t>((uint32_t)total_selector_clusters, cluster_index_iter + N);

#ifndef __EMSCRIPTEN__			
			m_params.m_pJob_pool->add_job([this, first_index, last_index] {
#endif

				for (uint32_t cluster_index = first_index; cluster_index < last_index; cluster_index++)
				{
					const basisu::vector<uint32_t>& cluster_block_indices = m_selector_cluster_block_indices[cluster_index];

					if (!cluster_block_indices.size())
						continue;

					uint64_t total_err[4][4][4];
					clear_obj(total_err);

					for (uint32_t cluster_block_index = 0; cluster_block_index < cluster_block_indices.size(); cluster_block_index++)
					{
						const uint32_t block_index = cluster_block_indices[cluster_block_index];

						const etc_block& blk = m_encoded_blocks[block_index];

						color_rgba blk_colors[4];
						blk.get_block_colors(blk_colors, 0);

						for (uint32_t y = 0; y < 4; y++)
						{
							for (uint32_t x = 0; x < 4; x++)
							{
								const color_rgba& orig_color = get_source_pixel_block(block_index)(x, y);

								if (m_params.m_perceptual)
								{
									for (uint32_t s = 0; s < 4; s++)
										total_err[y][x][s] += color_distance(true, blk_colors[s], orig_color, false);
								}
								else
								{
									for (uint32_t s = 0; s < 4; s++)
										total_err[y][x][s] += color_distance(false, blk_colors[s], orig_color, false);
								}
							} // x
						} // y

					} // cluster_block_index

					for (uint32_t y = 0; y < 4; y++)
					{
						for (uint32_t x = 0; x < 4; x++)
						{
							uint64_t best_err = total_err[y][x][0];
							uint8_t best_sel = 0;

							for (uint32_t s = 1; s < 4; s++)
							{
								if (total_err[y][x][s] < best_err)
								{
									best_err = total_err[y][x][s];
									best_sel = (uint8_t)s;
								}
							}

							m_optimized_cluster_selectors[cluster_index].set_selector(x, y, best_sel);
						} // x
					} // y

				} // cluster_index

#ifndef __EMSCRIPTEN__
				});
#endif

		} // cluster_index_iter

#ifndef __EMSCRIPTEN__
		m_params.m_pJob_pool->wait_for_all();
#endif

		debug_printf("Elapsed time: %3.3f secs\n", tm.get_elapsed_secs());
				
		if (m_params.m_debug_images)
		{
			uint32_t max_selector_cluster_size = 0;

			for (uint32_t i = 0; i < m_selector_cluster_block_indices.size(); i++)
				max_selector_cluster_size = maximum<uint32_t>(max_selector_cluster_size, (uint32_t)m_selector_cluster_block_indices[i].size());

			if ((max_selector_cluster_size * 5) < 32768)
			{
				const uint32_t x_spacer_len = 16;
				image selector_cluster_vis(x_spacer_len + max_selector_cluster_size * 5, (uint32_t)m_selector_cluster_block_indices.size() * 5);

				for (uint32_t selector_cluster_index = 0; selector_cluster_index < m_selector_cluster_block_indices.size(); selector_cluster_index++)
				{
					const basisu::vector<uint32_t> &cluster_block_indices = m_selector_cluster_block_indices[selector_cluster_index];

					for (uint32_t y = 0; y < 4; y++)
						for (uint32_t x = 0; x < 4; x++)
							selector_cluster_vis.set_clipped(x_spacer_len + x - 12, selector_cluster_index * 5 + y, color_rgba((m_optimized_cluster_selectors[selector_cluster_index].get_selector(x, y) * 255) / 3));

					for (uint32_t i = 0; i < cluster_block_indices.size(); i++)
					{
						uint32_t block_index = cluster_block_indices[i];

						const etc_block &blk = m_orig_encoded_blocks[block_index];
						
						for (uint32_t y = 0; y < 4; y++)
							for (uint32_t x = 0; x < 4; x++)
								selector_cluster_vis.set_clipped(x_spacer_len + x + 5 * i, selector_cluster_index * 5 + y, color_rgba((blk.get_selector(x, y) * 255) / 3));
					}
				}

				char buf[256];
				snprintf(buf, sizeof(buf), "selector_cluster_vis_%u.png", iter);
				save_png(buf, selector_cluster_vis);
			}
		}
	}